

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.cpp
# Opt level: O3

Event __thiscall Storage::Disk::PCMSegmentEventSource::get_next_event(PCMSegmentEventSource *this)

{
  ulong uVar1;
  uint uVar2;
  element_type *peVar3;
  ulong uVar4;
  long lVar5;
  _Bit_type *p_Var6;
  uint uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  peVar3 = (this->segment_).
           super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = this->bit_pointer_;
  uVar7 = 0;
  if (uVar4 == 0) {
    uVar7 = -((peVar3->length_of_a_bit).length >> 1);
  }
  (this->next_event_).length.length = uVar7;
  lVar5 = *(long *)&(peVar3->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start;
  uVar1 = (ulong)*(uint *)((long)&(peVar3->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data + 0x18) +
          ((long)(((_Bit_iterator *)
                  ((long)&(peVar3->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p - lVar5)
          * 8;
  uVar9 = uVar4;
  if (uVar4 < uVar1) {
    uVar2 = (peVar3->length_of_a_bit).length;
    uVar8 = (this->lfsr_).value_;
    uVar10 = uVar4;
    do {
      uVar9 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar9 = uVar10;
      }
      uVar11 = *(ulong *)(lVar5 + ((long)uVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8);
      uVar9 = uVar10 + 1;
      this->bit_pointer_ = uVar9;
      if ((uVar11 >> (uVar10 & 0x3f) & 1) != 0) {
LAB_00442be5:
        (this->next_event_).length.length = uVar7 + uVar2;
        goto LAB_00442beb;
      }
      p_Var6 = *(_Bit_type **)
                &(peVar3->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start;
      uVar11 = uVar8;
      if ((p_Var6 != (((_Bit_iterator *)
                      ((long)&(peVar3->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data + 0x10))->super__Bit_iterator_base).
                     _M_p) ||
         (*(uint *)((long)&(peVar3->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data + 0x18) != 0)) {
        uVar10 = uVar10 + 0x40;
        if (-1 < (long)uVar9) {
          uVar10 = uVar9;
        }
        if ((p_Var6[((long)uVar10 >> 6) +
                    ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             (uVar9 & 0x3f) & 1) != 0) {
          uVar11 = uVar8 >> 1 ^ (ulong)((uint)uVar8 & 1) * -0x7fffffffffffe61e;
          (this->lfsr_).value_ = uVar11;
          if ((uVar8 & 1) != 0) goto LAB_00442be5;
        }
      }
      uVar7 = uVar7 + uVar2;
      uVar8 = uVar11;
      uVar10 = uVar9;
    } while (uVar9 < uVar1);
    (this->next_event_).length.length = uVar7;
  }
  (this->next_event_).type = IndexHole;
  if (uVar4 <= uVar1) {
    (this->next_event_).length.length = uVar7 + ((peVar3->length_of_a_bit).length >> 1);
    this->bit_pointer_ = uVar9 + 1;
  }
LAB_00442beb:
  return this->next_event_;
}

Assistant:

Storage::Disk::Track::Event PCMSegmentEventSource::get_next_event() {
	// Track the initial bit pointer for potentially considering whether this was an
	// initial index hole or a subsequent one later on.
	const std::size_t initial_bit_pointer = bit_pointer_;

	// If starting from the beginning, pull half a bit backward, as if the initial bit
	// is set, it should be in the centre of its window.
	next_event_.length.length = bit_pointer_ ? 0 : -(segment_->length_of_a_bit.length >> 1);

	// search for the next bit that is set, if any
	while(bit_pointer_ < segment_->data.size()) {
		bool bit = segment_->data[bit_pointer_];
		++bit_pointer_;	// so this always points one beyond the most recent bit returned
		next_event_.length.length += segment_->length_of_a_bit.length;

		// if this bit is set, or is fuzzy and a random bit of 1 is selected, return the event.
		if(bit ||
			(!segment_->fuzzy_mask.empty() && segment_->fuzzy_mask[bit_pointer_] && lfsr_.next())
		)	return next_event_;
	}

	// If the end is reached without a bit being set, it'll be index holes from now on.
	next_event_.type = Track::Event::IndexHole;

	// Test whether this is the very first time that bits have been exhausted. If so then
	// allow an extra half bit's length to run from the position of the potential final transition
	// event to the end of the segment. Otherwise don't allow any extra time, as it's already
	// been consumed.
	if(initial_bit_pointer <= segment_->data.size()) {
		next_event_.length.length += (segment_->length_of_a_bit.length >> 1);
		bit_pointer_++;
	}
	return next_event_;
}